

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void convert_6u32s_C1R(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = 0;
  if ((length & 0xfffffffffffffffc) != 0) {
    do {
      bVar1 = *pSrc;
      bVar2 = pSrc[1];
      bVar3 = pSrc[2];
      pSrc = pSrc + 3;
      pDst[uVar4] = (uint)(bVar1 >> 2);
      pDst[uVar4 + 1] = (uint)(bVar2 >> 4) | (bVar1 & 3) << 4;
      pDst[uVar4 + 2] = (uint)(bVar3 >> 6) + (bVar2 & 0xf) * 4;
      pDst[uVar4 + 3] = bVar3 & 0x3f;
      uVar4 = uVar4 + 4;
    } while (uVar4 < (length & 0xfffffffffffffffc));
  }
  if ((length & 3) != 0) {
    bVar1 = *pSrc;
    pDst[uVar4] = (uint)(bVar1 >> 2);
    iVar5 = (int)(length & 3);
    if (iVar5 != 1) {
      bVar2 = pSrc[1];
      pDst[uVar4 + 1] = (uint)(bVar2 >> 4) | (bVar1 & 3) << 4;
      if (iVar5 == 3) {
        pDst[uVar4 + 2] = (uint)(pSrc[2] >> 6) + (bVar2 & 0xf) * 4;
      }
    }
  }
  return;
}

Assistant:

static void convert_6u32s_C1R(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                              OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i += 4U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        pDst[i + 0] = (OPJ_INT32)(val0 >> 2);
        pDst[i + 1] = (OPJ_INT32)(((val0 & 0x3U) << 4) | (val1 >> 4));
        pDst[i + 2] = (OPJ_INT32)(((val1 & 0xFU) << 2) | (val2 >> 6));
        pDst[i + 3] = (OPJ_INT32)(val2 & 0x3FU);

    }
    if (length & 3U) {
        OPJ_UINT32 val0 = *pSrc++;
        length = length & 3U;
        pDst[i + 0] = (OPJ_INT32)(val0 >> 2);

        if (length > 1U) {
            OPJ_UINT32 val1 = *pSrc++;
            pDst[i + 1] = (OPJ_INT32)(((val0 & 0x3U) << 4) | (val1 >> 4));
            if (length > 2U) {
                OPJ_UINT32 val2 = *pSrc++;
                pDst[i + 2] = (OPJ_INT32)(((val1 & 0xFU) << 2) | (val2 >> 6));
            }
        }
    }
}